

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan_mock_setup.cpp
# Opt level: O2

PhysicalDeviceDetails * add_basic_physical_device(VulkanMock *mock)

{
  long lVar1;
  VkExtensionProperties local_e68;
  PhysicalDeviceDetails local_d58;
  PhysicalDeviceDetails local_6c0;
  
  memset(&local_d58,0,0x124);
  memset(&local_d58.properties.limits,0,0x20c);
  memset(&local_d58.features,0,0xdc);
  memset(&local_d58.memory_properties,0,0x280);
  get_extension_properties(&local_e68,"VK_KHR_swapchain");
  std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::
  emplace_back<VkExtensionProperties>(&local_d58.extensions,&local_e68);
  local_d58.properties.apiVersion = 0x400000;
  local_e68.extensionName[0] = '\a';
  local_e68.extensionName[1] = '\0';
  local_e68.extensionName[2] = '\0';
  local_e68.extensionName[3] = '\0';
  local_e68.extensionName[4] = '\x01';
  local_e68.extensionName[5] = '\0';
  local_e68.extensionName[6] = '\0';
  local_e68.extensionName[7] = '\0';
  local_e68.extensionName[8] = '\0';
  local_e68.extensionName[9] = '\0';
  local_e68.extensionName[10] = '\0';
  local_e68.extensionName[0xb] = '\0';
  local_e68.extensionName[0xc] = '\x01';
  local_e68.extensionName[0xd] = '\0';
  local_e68.extensionName[0xe] = '\0';
  local_e68.extensionName[0xf] = '\0';
  local_e68.extensionName[0x10] = '\x01';
  local_e68.extensionName[0x11] = '\0';
  local_e68.extensionName[0x12] = '\0';
  local_e68.extensionName[0x13] = '\0';
  local_e68.extensionName[0x14] = '\x01';
  local_e68.extensionName[0x15] = '\0';
  local_e68.extensionName[0x16] = '\0';
  local_e68.extensionName[0x17] = '\0';
  std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::push_back
            (&local_d58.queue_family_properties,(value_type *)&local_e68);
  memcpy(&local_6c0,&local_d58,0x620);
  local_6c0.extensions.
  super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_d58.extensions.
       super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_6c0.extensions.
  super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_d58.extensions.
       super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_6c0.extensions.
  super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_d58.extensions.
       super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_d58.extensions.
  super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d58.extensions.
  super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d58.extensions.
  super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6c0.queue_family_properties.
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_d58.queue_family_properties.
       super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl
       .super__Vector_impl_data._M_start;
  local_6c0.queue_family_properties.
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_d58.queue_family_properties.
       super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl
       .super__Vector_impl_data._M_finish;
  local_6c0.queue_family_properties.
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_d58.queue_family_properties.
       super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  local_d58.queue_family_properties.
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d58.queue_family_properties.
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d58.queue_family_properties.
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6c0.features_pNextChain.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_d58.features_pNextChain.
       super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_6c0.features_pNextChain.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_d58.features_pNextChain.
       super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_6c0.features_pNextChain.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_d58.features_pNextChain.
       super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_d58.features_pNextChain.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d58.features_pNextChain.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d58.features_pNextChain.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6c0.created_device_handles.super__Vector_base<VkDevice_T_*,_std::allocator<VkDevice_T_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_d58.created_device_handles.
       super__Vector_base<VkDevice_T_*,_std::allocator<VkDevice_T_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_6c0.created_device_handles.super__Vector_base<VkDevice_T_*,_std::allocator<VkDevice_T_*>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_d58.created_device_handles.
       super__Vector_base<VkDevice_T_*,_std::allocator<VkDevice_T_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_6c0.created_device_handles.super__Vector_base<VkDevice_T_*,_std::allocator<VkDevice_T_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_d58.created_device_handles.
       super__Vector_base<VkDevice_T_*,_std::allocator<VkDevice_T_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_d58.created_device_handles.super__Vector_base<VkDevice_T_*,_std::allocator<VkDevice_T_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d58.created_device_handles.super__Vector_base<VkDevice_T_*,_std::allocator<VkDevice_T_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d58.created_device_handles.super__Vector_base<VkDevice_T_*,_std::allocator<VkDevice_T_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6c0.created_device_details.
  super__Vector_base<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_d58.created_device_details.
       super__Vector_base<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_6c0.created_device_details.
  super__Vector_base<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_d58.created_device_details.
       super__Vector_base<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_6c0.created_device_details.
  super__Vector_base<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_d58.created_device_details.
       super__Vector_base<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_d58.created_device_details.
  super__Vector_base<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d58.created_device_details.
  super__Vector_base<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d58.created_device_details.
  super__Vector_base<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  VulkanMock::add_physical_device(mock,&local_6c0);
  VulkanMock::PhysicalDeviceDetails::~PhysicalDeviceDetails(&local_6c0);
  lVar1 = *(long *)&mock->field_0xb8;
  VulkanMock::PhysicalDeviceDetails::~PhysicalDeviceDetails(&local_d58);
  return (PhysicalDeviceDetails *)(lVar1 + -0x698);
}

Assistant:

VulkanMock::PhysicalDeviceDetails& add_basic_physical_device(VulkanMock& mock) {
    VulkanMock::PhysicalDeviceDetails physical_device_details{};
    physical_device_details.extensions.push_back(get_extension_properties(VK_KHR_SWAPCHAIN_EXTENSION_NAME));
    physical_device_details.properties.apiVersion = VK_API_VERSION_1_0;
    VkQueueFamilyProperties queue_family_properties{};
    queue_family_properties.queueCount = 1;
    queue_family_properties.queueFlags = VK_QUEUE_GRAPHICS_BIT | VK_QUEUE_COMPUTE_BIT | VK_QUEUE_TRANSFER_BIT;
    queue_family_properties.minImageTransferGranularity = { 1, 1, 1 };
    physical_device_details.queue_family_properties.push_back(queue_family_properties);
    mock.add_physical_device(std::move(physical_device_details));
    return mock.physical_devices_details.back();
}